

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.cpp
# Opt level: O0

Engine * __thiscall
adios2::core::IO::Open(IO *this,string *name,Mode mode,Comm *comm,char *md,size_t mdsize)

{
  bool bVar1;
  int iVar2;
  Mode MVar3;
  element_type *peVar4;
  size_type sVar5;
  pointer pvVar6;
  pointer pvVar7;
  pointer ppVar8;
  element_type *peVar9;
  Mode in_EDX;
  string *in_RSI;
  long in_RDI;
  shared_ptr<adios2::core::Engine> *in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>_>_>,_bool>
  pVar10;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>_>_>,_bool>
  itEngine;
  const_iterator f;
  const_iterator it;
  string msg_1;
  shared_ptr<adios2::core::Engine> engine_ptr;
  string msg;
  char v_1;
  char v;
  string engineTypeLC;
  bool isDefaultEngine;
  shared_ptr<adios2::core::Engine> engine;
  string *in_stack_000007e8;
  Mode mode_to_use;
  bool isEngineActive;
  bool isEngineFound;
  iterator itEngineFound;
  ScopedTimer __var2535;
  key_type *in_stack_fffffffffffff708;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff710;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffff718;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffff720;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffff728;
  allocator *paVar11;
  char *in_stack_fffffffffffff730;
  Mode __args_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff738;
  undefined4 in_stack_fffffffffffff740;
  Mode in_stack_fffffffffffff744;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff748;
  IO *in_stack_fffffffffffff750;
  string *in_stack_fffffffffffff758;
  string *in_stack_fffffffffffff760;
  string *in_stack_fffffffffffff768;
  string *in_stack_fffffffffffff770;
  undefined4 in_stack_fffffffffffff778;
  undefined4 in_stack_fffffffffffff77c;
  undefined8 in_stack_fffffffffffff798;
  undefined1 caseSensitive;
  string *in_stack_fffffffffffff7a0;
  undefined4 in_stack_fffffffffffff7a8;
  undefined4 in_stack_fffffffffffff7ac;
  string local_730 [39];
  allocator local_709;
  string local_708 [39];
  allocator local_6e1;
  string local_6e0 [39];
  allocator local_6b9;
  vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  *in_stack_fffffffffffff948;
  Comm *in_stack_fffffffffffff950;
  IO *in_stack_fffffffffffff958;
  string *in_stack_fffffffffffff960;
  string local_678 [32];
  string local_658 [39];
  undefined1 local_631 [40];
  undefined1 local_609 [40];
  undefined1 local_5e1 [105];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::IO::EngineFactoryEntry>,_true>
  local_578;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::IO::EngineFactoryEntry>,_true>
  local_570;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_true>
  local_568;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_true>
  local_560;
  allocator local_551;
  string local_550 [39];
  allocator local_529;
  string local_528 [39];
  allocator local_501;
  string local_500 [32];
  string local_4e0 [32];
  string local_4c0 [32];
  string local_4a0 [32];
  string local_480 [32];
  _Base_ptr local_460;
  allocator local_441;
  string local_440 [39];
  allocator local_419;
  string local_418 [39];
  allocator local_3f1;
  string local_3f0 [32];
  string local_3d0 [32];
  string local_3b0 [32];
  string local_390 [32];
  string local_370 [39];
  allocator local_349;
  string local_348 [39];
  allocator local_321;
  string local_320 [39];
  allocator local_2f9;
  string local_2f8 [39];
  allocator local_2d1;
  string local_2d0 [39];
  allocator local_2a9;
  string local_2a8 [39];
  allocator local_281;
  string local_280 [39];
  allocator local_259;
  string local_258 [39];
  allocator local_231;
  string local_230 [38];
  char local_20a;
  allocator local_209;
  string local_208 [32];
  string local_1e8 [38];
  char local_1c2;
  allocator local_1c1;
  string local_1c0 [39];
  allocator local_199;
  string local_198 [32];
  char *local_178;
  undefined8 local_170;
  undefined8 local_168;
  undefined8 local_160;
  string local_158 [39];
  byte local_131;
  string local_120 [32];
  string local_100 [39];
  allocator local_d9;
  string local_d8 [39];
  allocator local_b1;
  string local_b0 [39];
  allocator local_89;
  string local_88 [32];
  Mode local_68;
  byte local_61;
  _Self local_60;
  byte local_51;
  _Self local_50 [4];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_30;
  shared_ptr<adios2::core::Engine> *local_28;
  Mode local_14;
  string *local_10;
  
  caseSensitive = (undefined1)((ulong)in_stack_fffffffffffff798 >> 0x38);
  local_30 = in_R9;
  local_28 = in_R8;
  local_14 = in_EDX;
  local_10 = in_RSI;
  if ((Open(std::__cxx11::string_const&,adios2::Mode,adios2::helper::Comm,char_const*,unsigned_long)
       ::__var535 == '\0') &&
     (iVar2 = __cxa_guard_acquire(&Open(std::__cxx11::string_const&,adios2::Mode,adios2::helper::Comm,char_const*,unsigned_long)
                                   ::__var535), iVar2 != 0)) {
    Open::__var535 = (void *)ps_timer_create_("IO::Open");
    __cxa_guard_release(&Open(std::__cxx11::string_const&,adios2::Mode,adios2::helper::Comm,char_const*,unsigned_long)
                         ::__var535);
  }
  external::perfstubs_profiler::ScopedTimer::ScopedTimer
            ((ScopedTimer *)in_stack_fffffffffffff710,in_stack_fffffffffffff708);
  local_50[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>_>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>_>_>_>
               *)in_stack_fffffffffffff708,(key_type *)0x89e649);
  local_60._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>_>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>_>_>_>
              *)in_stack_fffffffffffff708);
  local_51 = std::operator!=(local_50,&local_60);
  local_61 = 0;
  local_68 = local_14;
  if ((bool)local_51) {
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>_>_>
    ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>_>_>
                  *)0x89e6ca);
    peVar4 = std::
             __shared_ptr_access<adios2::core::Engine,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator*((__shared_ptr_access<adios2::core::Engine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)in_stack_fffffffffffff710);
    bVar1 = Engine::operator_cast_to_bool(peVar4);
    if (bVar1) {
      local_61 = 1;
    }
  }
  if (((local_51 & 1) != 0) && ((local_61 & 1) != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_88,"Core",&local_89);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b0,"IO",&local_b1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d8,"Open",&local_d9);
    std::operator+((char *)in_stack_fffffffffffff758,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff750);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff718._M_current,(char *)in_stack_fffffffffffff710);
    helper::Throw<std::invalid_argument>
              (in_stack_fffffffffffff770,in_stack_fffffffffffff768,in_stack_fffffffffffff760,
               in_stack_fffffffffffff758,(int)((ulong)in_stack_fffffffffffff750 >> 0x20));
    std::__cxx11::string::~string(local_100);
    std::__cxx11::string::~string(local_120);
    std::__cxx11::string::~string(local_d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_d9);
    std::__cxx11::string::~string(local_b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_b1);
    std::__cxx11::string::~string(local_88);
    std::allocator<char>::~allocator((allocator<char> *)&local_89);
  }
  if (((local_51 & 1) != 0) && ((local_61 & 1) == 0)) {
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>_>_>_>
    ::erase((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>_>_>_>
             *)in_stack_fffffffffffff710,in_stack_fffffffffffff708);
  }
  std::shared_ptr<adios2::core::Engine>::shared_ptr((shared_ptr<adios2::core::Engine> *)0x89e9f3);
  local_131 = std::__cxx11::string::empty();
  std::__cxx11::string::string(local_158,(string *)(in_RDI + 0xa8));
  if ((local_131 & 1) == 0) {
    local_160 = std::__cxx11::string::begin();
    local_168 = std::__cxx11::string::end();
    local_170 = std::__cxx11::string::begin();
    local_178 = (char *)std::
                        transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)>
                                  (in_stack_fffffffffffff728,in_stack_fffffffffffff720,
                                   in_stack_fffffffffffff718,
                                   (_func_int_int *)in_stack_fffffffffffff710);
  }
  bVar1 = std::operator==(in_stack_fffffffffffff710,(char *)in_stack_fffffffffffff708);
  if ((((bVar1) ||
       (bVar1 = std::operator==(in_stack_fffffffffffff710,(char *)in_stack_fffffffffffff708), bVar1)
       ) || (bVar1 = std::operator==(in_stack_fffffffffffff710,(char *)in_stack_fffffffffffff708),
            bVar1)) || ((local_131 & 1) != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_198,".h5",&local_199);
    bVar1 = helper::EndsWith((string *)CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8)
                             ,in_stack_fffffffffffff7a0,(bool)caseSensitive);
    std::__cxx11::string::~string(local_198);
    std::allocator<char>::~allocator((allocator<char> *)&local_199);
    if (bVar1) {
      std::__cxx11::string::operator=(local_158,"hdf5");
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1c0,".aca",&local_1c1);
      bVar1 = helper::EndsWith((string *)
                               CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8),
                               in_stack_fffffffffffff7a0,(bool)caseSensitive);
      std::__cxx11::string::~string(local_1c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
      if (bVar1) {
        std::__cxx11::string::operator=(local_158,"campaign");
      }
      else if ((local_68 == Read) || (local_68 == ReadRandomAccess)) {
        bVar1 = adios2sys::SystemTools::FileIsDirectory(in_stack_000007e8);
        if (bVar1) {
          local_1c2 = helper::BPVersion(in_stack_fffffffffffff760,(Comm *)in_stack_fffffffffffff758,
                                        (vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                                         *)in_stack_fffffffffffff750);
          std::__cxx11::string::operator=(local_158,"bp");
          std::__cxx11::string::push_back((char)local_158);
        }
        else {
          std::operator+(in_stack_fffffffffffff738,in_stack_fffffffffffff730);
          bVar1 = adios2sys::SystemTools::FileIsDirectory(in_stack_000007e8);
          std::__cxx11::string::~string(local_1e8);
          if (bVar1) {
            std::__cxx11::string::operator=(local_158,"mhs");
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_208,".bp",&local_209);
            bVar1 = helper::EndsWith((string *)
                                     CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8),
                                     in_stack_fffffffffffff7a0,(bool)caseSensitive);
            std::__cxx11::string::~string(local_208);
            std::allocator<char>::~allocator((allocator<char> *)&local_209);
            if (bVar1) {
              std::__cxx11::string::operator=(local_158,"bp3");
            }
            else {
              bVar1 = helper::IsHDF5File(in_stack_fffffffffffff960,in_stack_fffffffffffff958,
                                         in_stack_fffffffffffff950,in_stack_fffffffffffff948);
              if (bVar1) {
                std::__cxx11::string::operator=(local_158,"hdf5");
              }
              else {
                std::__cxx11::string::operator=(local_158,"bp3");
              }
            }
          }
        }
      }
      else {
        std::__cxx11::string::operator=(local_158,"bp5");
      }
    }
  }
  __args_2 = (Mode)((ulong)in_stack_fffffffffffff730 >> 0x20);
  bVar1 = std::operator==(in_stack_fffffffffffff710,(char *)in_stack_fffffffffffff708);
  if (bVar1) {
    local_20a = helper::BPVersion(in_stack_fffffffffffff760,(Comm *)in_stack_fffffffffffff758,
                                  (vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                                   *)in_stack_fffffffffffff750);
    std::__cxx11::string::operator=(local_158,"bp");
    std::__cxx11::string::push_back((char)local_158);
  }
  bVar1 = std::operator==(in_stack_fffffffffffff710,(char *)in_stack_fffffffffffff708);
  if (bVar1) {
    if (local_68 == Append) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_230,"Core",&local_231);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_258,"IO",&local_259);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_280,"Open",&local_281);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_2a8,"Append mode is not supported in the inline engine.",&local_2a9);
      helper::Throw<std::runtime_error>
                (in_stack_fffffffffffff770,in_stack_fffffffffffff768,in_stack_fffffffffffff760,
                 in_stack_fffffffffffff758,(int)((ulong)in_stack_fffffffffffff750 >> 0x20));
      std::__cxx11::string::~string(local_2a8);
      std::allocator<char>::~allocator((allocator<char> *)&local_2a9);
      std::__cxx11::string::~string(local_280);
      std::allocator<char>::~allocator((allocator<char> *)&local_281);
      std::__cxx11::string::~string(local_258);
      std::allocator<char>::~allocator((allocator<char> *)&local_259);
      std::__cxx11::string::~string(local_230);
      std::allocator<char>::~allocator((allocator<char> *)&local_231);
    }
    if (local_68 == Sync) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2d0,"Core",&local_2d1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2f8,"IO",&local_2f9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_320,"Open",&local_321);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_348,"Sync mode is not supported in the inline engine.",&local_349);
      helper::Throw<std::runtime_error>
                (in_stack_fffffffffffff770,in_stack_fffffffffffff768,in_stack_fffffffffffff760,
                 in_stack_fffffffffffff758,(int)((ulong)in_stack_fffffffffffff750 >> 0x20));
      std::__cxx11::string::~string(local_348);
      std::allocator<char>::~allocator((allocator<char> *)&local_349);
      std::__cxx11::string::~string(local_320);
      std::allocator<char>::~allocator((allocator<char> *)&local_321);
      std::__cxx11::string::~string(local_2f8);
      std::allocator<char>::~allocator((allocator<char> *)&local_2f9);
      std::__cxx11::string::~string(local_2d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_2d1);
    }
    sVar5 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>_>_>_>
            ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>_>_>_>
                    *)0x89f55f);
    if (1 < sVar5) {
      std::operator+((char *)in_stack_fffffffffffff758,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff750);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff718._M_current,(char *)in_stack_fffffffffffff710);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff718._M_current,in_stack_fffffffffffff710);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff718._M_current,(char *)in_stack_fffffffffffff710);
      std::__cxx11::string::~string(local_390);
      std::__cxx11::string::~string(local_3b0);
      std::__cxx11::string::~string(local_3d0);
      std::__cxx11::string::operator+=
                (local_370,"An inline engine must have exactly one writer, and one reader. ");
      std::__cxx11::string::operator+=
                (local_370,"There are already two engines declared, so no more can be added.");
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_3f0,"Core",&local_3f1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_418,"IO",&local_419);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_440,"Open",&local_441);
      helper::Throw<std::runtime_error>
                (in_stack_fffffffffffff770,in_stack_fffffffffffff768,in_stack_fffffffffffff760,
                 in_stack_fffffffffffff758,(int)((ulong)in_stack_fffffffffffff750 >> 0x20));
      std::__cxx11::string::~string(local_440);
      std::allocator<char>::~allocator((allocator<char> *)&local_441);
      std::__cxx11::string::~string(local_418);
      std::allocator<char>::~allocator((allocator<char> *)&local_419);
      std::__cxx11::string::~string(local_3f0);
      std::allocator<char>::~allocator((allocator<char> *)&local_3f1);
      std::__cxx11::string::~string(local_370);
    }
    sVar5 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>_>_>_>
            ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>_>_>_>
                    *)0x89f8b1);
    if (sVar5 == 1) {
      local_460 = (_Base_ptr)
                  std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>_>_>_>
                  ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>_>_>_>
                           *)in_stack_fffffffffffff708);
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>_>_>
      ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>_>_>
                    *)0x89f8e4);
      std::shared_ptr<adios2::core::Engine>::shared_ptr
                ((shared_ptr<adios2::core::Engine> *)in_stack_fffffffffffff710,
                 (shared_ptr<adios2::core::Engine> *)in_stack_fffffffffffff708);
      peVar4 = std::
               __shared_ptr_access<adios2::core::Engine,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<adios2::core::Engine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x89f905);
      MVar3 = Engine::OpenMode(peVar4);
      if (MVar3 == local_68) {
        std::__shared_ptr_access<adios2::core::Engine,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<adios2::core::Engine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x89f927);
        std::operator+((char *)in_stack_fffffffffffff758,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff750);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff718._M_current,(char *)in_stack_fffffffffffff710);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff718._M_current,in_stack_fffffffffffff710);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff718._M_current,(char *)in_stack_fffffffffffff710);
        std::__cxx11::string::~string(local_4a0);
        std::__cxx11::string::~string(local_4c0);
        std::__cxx11::string::~string(local_4e0);
        std::__cxx11::string::operator+=
                  (local_480,"The inline engine requires exactly one writer and one reader.");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_500,"Core",&local_501);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_528,"IO",&local_529);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_550,"Open",&local_551);
        helper::Throw<std::runtime_error>
                  (in_stack_fffffffffffff770,in_stack_fffffffffffff768,in_stack_fffffffffffff760,
                   in_stack_fffffffffffff758,(int)((ulong)in_stack_fffffffffffff750 >> 0x20));
        std::__cxx11::string::~string(local_550);
        std::allocator<char>::~allocator((allocator<char> *)&local_551);
        std::__cxx11::string::~string(local_528);
        std::allocator<char>::~allocator((allocator<char> *)&local_529);
        std::__cxx11::string::~string(local_500);
        std::allocator<char>::~allocator((allocator<char> *)&local_501);
        std::__cxx11::string::~string(local_480);
      }
      std::shared_ptr<adios2::core::Engine>::~shared_ptr
                ((shared_ptr<adios2::core::Engine> *)0x89fc63);
    }
  }
  if (local_68 == ReadRandomAccess) {
    local_560._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
         ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                 *)in_stack_fffffffffffff708,(key_type *)0x89fc97);
    local_568._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
         ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                *)in_stack_fffffffffffff708);
    bVar1 = std::__detail::operator!=(&local_560,&local_568);
    if ((bVar1) &&
       (pvVar6 = std::__detail::
                 _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_false,_true>
                 ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_false,_true>
                               *)0x89fced), (pvVar6->second & 1U) == 0)) {
      local_68 = Read;
    }
  }
  local_570._M_cur =
       (__node_type *)anon_unknown_40::FactoryLookup((string *)in_stack_fffffffffffff728._M_current)
  ;
  local_578._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::IO::EngineFactoryEntry,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::IO::EngineFactoryEntry>_>_>
       ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::IO::EngineFactoryEntry,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::IO::EngineFactoryEntry>_>_>
              *)in_stack_fffffffffffff708);
  bVar1 = std::__detail::operator!=(&local_570,&local_578);
  if (bVar1) {
    if ((local_28 == (shared_ptr<adios2::core::Engine> *)0x0) || (local_68 != ReadRandomAccess)) {
      if ((local_68 == Read) || (local_68 == ReadRandomAccess)) {
        std::__detail::
        _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::IO::EngineFactoryEntry>,_false,_true>
        ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::IO::EngineFactoryEntry>,_false,_true>
                      *)0x89fe96);
        helper::Comm::Comm((Comm *)in_stack_fffffffffffff710,(Comm *)in_stack_fffffffffffff708);
        std::
        function<std::shared_ptr<adios2::core::Engine>_(adios2::core::IO_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_adios2::Mode,_adios2::helper::Comm)>
        ::operator()((function<std::shared_ptr<adios2::core::Engine>_(adios2::core::IO_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_adios2::Mode,_adios2::helper::Comm)>
                      *)in_stack_fffffffffffff748,
                     (IO *)CONCAT44(in_stack_fffffffffffff744,in_stack_fffffffffffff740),
                     in_stack_fffffffffffff738,__args_2,(Comm *)in_stack_fffffffffffff728._M_current
                    );
        std::shared_ptr<adios2::core::Engine>::operator=
                  ((shared_ptr<adios2::core::Engine> *)in_stack_fffffffffffff710,
                   (shared_ptr<adios2::core::Engine> *)in_stack_fffffffffffff708);
        std::shared_ptr<adios2::core::Engine>::~shared_ptr
                  ((shared_ptr<adios2::core::Engine> *)0x89ff2a);
        helper::Comm::~Comm((Comm *)0x89ff37);
      }
      else {
        pvVar7 = std::__detail::
                 _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::IO::EngineFactoryEntry>,_false,_true>
                 ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::IO::EngineFactoryEntry>,_false,_true>
                               *)0x89ff6f);
        in_stack_fffffffffffff768 = (string *)&(pvVar7->second).MakeWriter;
        helper::Comm::Comm((Comm *)in_stack_fffffffffffff710,(Comm *)in_stack_fffffffffffff708);
        std::
        function<std::shared_ptr<adios2::core::Engine>_(adios2::core::IO_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_adios2::Mode,_adios2::helper::Comm)>
        ::operator()((function<std::shared_ptr<adios2::core::Engine>_(adios2::core::IO_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_adios2::Mode,_adios2::helper::Comm)>
                      *)in_stack_fffffffffffff748,
                     (IO *)CONCAT44(in_stack_fffffffffffff744,in_stack_fffffffffffff740),
                     in_stack_fffffffffffff738,__args_2,(Comm *)in_stack_fffffffffffff728._M_current
                    );
        std::shared_ptr<adios2::core::Engine>::operator=
                  ((shared_ptr<adios2::core::Engine> *)in_stack_fffffffffffff710,
                   (shared_ptr<adios2::core::Engine> *)in_stack_fffffffffffff708);
        std::shared_ptr<adios2::core::Engine>::~shared_ptr
                  ((shared_ptr<adios2::core::Engine> *)0x89fff7);
        helper::Comm::~Comm((Comm *)0x8a0004);
        in_stack_fffffffffffff770 = local_10;
      }
    }
    else {
      std::__detail::
      _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::IO::EngineFactoryEntry>,_false,_true>
      ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::IO::EngineFactoryEntry>,_false,_true>
                    *)0x89fd85);
      helper::Comm::Comm((Comm *)in_stack_fffffffffffff710,(Comm *)in_stack_fffffffffffff708);
      std::
      function<std::shared_ptr<adios2::core::Engine>_(adios2::core::IO_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_adios2::Mode,_adios2::helper::Comm,_const_char_*,_unsigned_long)>
      ::operator()((function<std::shared_ptr<adios2::core::Engine>_(adios2::core::IO_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_adios2::Mode,_adios2::helper::Comm,_const_char_*,_unsigned_long)>
                    *)in_stack_fffffffffffff758,in_stack_fffffffffffff750,in_stack_fffffffffffff748,
                   in_stack_fffffffffffff744,(Comm *)in_stack_fffffffffffff738,
                   (char *)in_stack_fffffffffffff770,
                   CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778));
      std::shared_ptr<adios2::core::Engine>::operator=
                ((shared_ptr<adios2::core::Engine> *)local_30,local_28);
      std::shared_ptr<adios2::core::Engine>::~shared_ptr
                ((shared_ptr<adios2::core::Engine> *)0x89fe39);
      helper::Comm::~Comm((Comm *)0x89fe46);
      in_stack_fffffffffffff710 = local_30;
    }
  }
  else {
    in_stack_fffffffffffff760 = (string *)local_5e1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_5e1 + 1),"Core",(allocator *)in_stack_fffffffffffff760);
    in_stack_fffffffffffff758 = (string *)local_609;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_609 + 1),"IO",(allocator *)in_stack_fffffffffffff758);
    in_stack_fffffffffffff750 = (IO *)local_631;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_631 + 1),"Open",(allocator *)in_stack_fffffffffffff750);
    std::operator+((char *)in_stack_fffffffffffff758,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff750);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff718._M_current,(char *)in_stack_fffffffffffff710);
    helper::Throw<std::invalid_argument>
              (in_stack_fffffffffffff770,in_stack_fffffffffffff768,in_stack_fffffffffffff760,
               in_stack_fffffffffffff758,(int)((ulong)in_stack_fffffffffffff750 >> 0x20));
    std::__cxx11::string::~string(local_658);
    std::__cxx11::string::~string(local_678);
    std::__cxx11::string::~string((string *)(local_631 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_631);
    std::__cxx11::string::~string((string *)(local_609 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_609);
    std::__cxx11::string::~string((string *)(local_5e1 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_5e1);
  }
  pVar10 = std::
           map<std::__cxx11::string,std::shared_ptr<adios2::core::Engine>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<adios2::core::Engine>>>>
           ::emplace<std::__cxx11::string_const&,std::shared_ptr<adios2::core::Engine>>
                     ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>_>_>_>
                       *)in_stack_fffffffffffff720._M_current,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      in_stack_fffffffffffff718._M_current,
                      (shared_ptr<adios2::core::Engine> *)in_stack_fffffffffffff710);
  if (((undefined1  [16])pVar10 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    paVar11 = &local_6b9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&stack0xfffffffffffff948,"Core",paVar11);
    paVar11 = &local_6e1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_6e0,"IO",paVar11);
    paVar11 = &local_709;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_708,"Open",paVar11);
    std::operator+((char *)in_stack_fffffffffffff758,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff750);
    helper::Throw<std::invalid_argument>
              (in_stack_fffffffffffff770,in_stack_fffffffffffff768,in_stack_fffffffffffff760,
               in_stack_fffffffffffff758,(int)((ulong)in_stack_fffffffffffff750 >> 0x20));
    std::__cxx11::string::~string(local_730);
    std::__cxx11::string::~string(local_708);
    std::allocator<char>::~allocator((allocator<char> *)&local_709);
    std::__cxx11::string::~string(local_6e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_6e1);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffff948);
    std::allocator<char>::~allocator((allocator<char> *)&local_6b9);
  }
  ppVar8 = std::
           _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>_>_>
           ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>_>_>
                         *)0x8a0511);
  peVar9 = std::__shared_ptr<adios2::core::Engine,_(__gnu_cxx::_Lock_policy)2>::get
                     (&(ppVar8->second).
                       super___shared_ptr<adios2::core::Engine,_(__gnu_cxx::_Lock_policy)2>);
  std::__cxx11::string::~string(local_158);
  std::shared_ptr<adios2::core::Engine>::~shared_ptr((shared_ptr<adios2::core::Engine> *)0x8a053c);
  external::perfstubs_profiler::ScopedTimer::~ScopedTimer((ScopedTimer *)in_stack_fffffffffffff710);
  return peVar9;
}

Assistant:

Engine &IO::Open(const std::string &name, const Mode mode, helper::Comm comm, const char *md,
                 const size_t mdsize)
{
    PERFSTUBS_SCOPED_TIMER("IO::Open");
    auto itEngineFound = m_Engines.find(name);
    const bool isEngineFound = (itEngineFound != m_Engines.end());
    bool isEngineActive = false;
    Mode mode_to_use = mode;

    if (isEngineFound)
    {
        if (*itEngineFound->second)
        {
            isEngineActive = true;
        }
    }

    if (isEngineFound)
    {
        if (isEngineActive) // check if active
        {
            helper::Throw<std::invalid_argument>("Core", "IO", "Open",
                                                 "Engine " + name + " is opened twice");
        }
    }

    if (isEngineFound)
    {
        if (!isEngineActive)
        {
            m_Engines.erase(name);
        }
    }

    std::shared_ptr<Engine> engine;
    const bool isDefaultEngine = m_EngineType.empty() ? true : false;
    std::string engineTypeLC = m_EngineType;
    if (!isDefaultEngine)
    {
        std::transform(engineTypeLC.begin(), engineTypeLC.end(), engineTypeLC.begin(), ::tolower);
    }

    /* Second step in handling virtual engines */
    /* BPFile for read needs to use BP5, BP4, or BP3 depending on the file's
     * version
     */
    if ((engineTypeLC == "file" || engineTypeLC == "bpfile" || engineTypeLC == "bp" ||
         isDefaultEngine))
    {
        if (helper::EndsWith(name, ".h5", false))
        {
            engineTypeLC = "hdf5";
        }
        else if (helper::EndsWith(name, ".aca", false))
        {
            engineTypeLC = "campaign";
        }
        else if ((mode_to_use == Mode::Read) || (mode_to_use == Mode::ReadRandomAccess))
        {
            if (adios2sys::SystemTools::FileIsDirectory(name))
            {
                char v = helper::BPVersion(name, comm, m_TransportsParameters);
                engineTypeLC = "bp";
                engineTypeLC.push_back(v);
            }
            else if (adios2sys::SystemTools::FileIsDirectory(name + ".tier0"))
            {
                engineTypeLC = "mhs";
            }
            else
            {
                if (helper::EndsWith(name, ".bp", false))
                {
                    engineTypeLC = "bp3";
                }
                else
                {
                    /* We need to figure out the type of file
                     * from the file itself
                     */
                    if (helper::IsHDF5File(name, *this, comm, m_TransportsParameters))
                    {
                        engineTypeLC = "hdf5";
                    }
                    else
                    {
                        engineTypeLC = "bp3";
                    }
                }
            }
        }
        else
        {
            // File default for writing: BP5
            engineTypeLC = "bp5";
        }
    }

    /* Note: Mismatch between BP4/BP5 writer and FileStream reader is not
       handled if writer has not created the directory yet, when FileStream
       falls back to default (BP4) */
    if (engineTypeLC == "filestream")
    {
        char v = helper::BPVersion(name, comm, m_TransportsParameters);
        engineTypeLC = "bp";
        engineTypeLC.push_back(v);
        // std::cout << "Engine " << engineTypeLC << " selected for FileStream"
        //          << std::endl;
    }

    // For the inline engine, there must be exactly 1 reader, and exactly 1
    // writer.
    if (engineTypeLC == "inline")
    {
        if (mode_to_use == Mode::Append)
        {
            helper::Throw<std::runtime_error>("Core", "IO", "Open",
                                              "Append mode is not supported in the inline engine.");
        }

        // See inline.rst:44
        if (mode_to_use == Mode::Sync)
        {
            helper::Throw<std::runtime_error>("Core", "IO", "Open",
                                              "Sync mode is not supported in the inline engine.");
        }

        if (m_Engines.size() >= 2)
        {
            std::string msg = "Failed to add engine " + name + " to IO \'" + m_Name + "\'. ";
            msg += "An inline engine must have exactly one writer, and one "
                   "reader. ";
            msg += "There are already two engines declared, so no more can be "
                   "added.";
            helper::Throw<std::runtime_error>("Core", "IO", "Open", msg);
        }
        // Now protect against declaration of two writers, or declaration of
        // two readers:
        if (m_Engines.size() == 1)
        {
            auto engine_ptr = m_Engines.begin()->second;
            if (engine_ptr->OpenMode() == mode_to_use)
            {
                std::string msg = "The previously added engine " + engine_ptr->m_Name +
                                  " is already opened in same mode requested for " + name + ". ";
                msg += "The inline engine requires exactly one writer and one "
                       "reader.";
                helper::Throw<std::runtime_error>("Core", "IO", "Open", msg);
            }
        }
    }

    if (mode_to_use == Mode::ReadRandomAccess)
    {
        // older engines don't know about ReadRandomAccess Mode
        auto it = ReadRandomAccess_Supported.find(engineTypeLC);
        if (it != ReadRandomAccess_Supported.end())
        {
            if (!it->second)
            {
                mode_to_use = Mode::Read;
            }
        }
    }

    auto f = FactoryLookup(engineTypeLC);
    if (f != Factory.end())
    {
        if (md && mode_to_use == Mode::ReadRandomAccess)
        {
            engine =
                f->second.MakeReaderWithMD(*this, name, mode_to_use, std::move(comm), md, mdsize);
        }
        else if ((mode_to_use == Mode::Read) || (mode_to_use == Mode::ReadRandomAccess))
        {
            engine = f->second.MakeReader(*this, name, mode_to_use, std::move(comm));
        }
        else
        {
            engine = f->second.MakeWriter(*this, name, mode_to_use, std::move(comm));
        }
    }
    else
    {
        helper::Throw<std::invalid_argument>("Core", "IO", "Open",
                                             "Engine type " + m_EngineType + " is not valid");
    }

    auto itEngine = m_Engines.emplace(name, std::move(engine));

    if (!itEngine.second)
    {
        helper::Throw<std::invalid_argument>("Core", "IO", "Open",
                                             "failed to create Engine " + m_EngineType);
    }
    // return a reference
    return *itEngine.first->second.get();
}